

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5StorageStmtRelease(Fts5Storage *p,int eStmt,sqlite3_stmt *pStmt)

{
  undefined8 in_RDX;
  int in_ESI;
  sqlite3_stmt *in_RDI;
  
  if (*(long *)(in_RDI + (long)in_ESI * 8 + 0x30) == 0) {
    sqlite3_reset(pStmt);
    *(undefined8 *)(in_RDI + (long)in_ESI * 8 + 0x30) = in_RDX;
  }
  else {
    sqlite3_finalize(in_RDI);
  }
  return;
}

Assistant:

static void sqlite3Fts5StorageStmtRelease(
  Fts5Storage *p,
  int eStmt,
  sqlite3_stmt *pStmt
){
  assert( eStmt==FTS5_STMT_SCAN_ASC
       || eStmt==FTS5_STMT_SCAN_DESC
       || eStmt==FTS5_STMT_LOOKUP
  );
  if( p->aStmt[eStmt]==0 ){
    sqlite3_reset(pStmt);
    p->aStmt[eStmt] = pStmt;
  }else{
    sqlite3_finalize(pStmt);
  }
}